

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::CheckTypeAndMergeFrom
          (CustomModel_CustomModelParamValue *this,MessageLite *from)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  ulong uVar4;
  LogMessage *other;
  undefined8 *puVar5;
  _func_int **pp_Var6;
  ValueUnion VVar7;
  LogFinisher LStack_61;
  ValueUnion VStack_60;
  LogMessage LStack_58;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__CustomModel_CustomModelParamValue_004909c8) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::CustomModel_CustomModelParamValue *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((CustomModel_CustomModelParamValue *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/CustomModel.pb.cc"
               ,0x181);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_61,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_58);
  }
  iVar2 = *(int *)((long)&from[1]._internal_metadata_.ptr_ + 4);
  if (iVar2 < 0x28) {
    if (iVar2 == 10) {
      VVar7 = *(ValueUnion *)(from + 1);
      if (this->_oneof_case_[0] != 10) {
        VStack_60 = *(ValueUnion *)(from + 1);
        clear_value(this);
        this->_oneof_case_[0] = 10;
        VVar7 = VStack_60;
      }
      this->value_ = VVar7;
      goto LAB_0031f8ca;
    }
    if (iVar2 != 0x14) {
      if (iVar2 == 0x1e) {
        iVar3 = *(int32_t *)&from[1]._vptr_MessageLite;
        if (this->_oneof_case_[0] != 0x1e) {
          clear_value(this);
          this->_oneof_case_[0] = 0x1e;
        }
        (this->value_).intvalue_ = iVar3;
      }
      goto LAB_0031f8ca;
    }
    pp_Var6 = from[1]._vptr_MessageLite;
    if (this->_oneof_case_[0] != 0x14) {
      clear_value(this);
      this->_oneof_case_[0] = 0x14;
LAB_0031f881:
      (this->value_).doublevalue_ =
           (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
  }
  else {
    if (iVar2 == 0x28) {
      VVar7 = *(ValueUnion *)(from + 1);
      if (this->_oneof_case_[0] != 0x28) {
        clear_value(this);
        this->_oneof_case_[0] = 0x28;
      }
      this->value_ = VVar7;
      goto LAB_0031f8ca;
    }
    if (iVar2 == 0x32) {
      bVar1 = *(bool *)&from[1]._vptr_MessageLite;
      if (this->_oneof_case_[0] != 0x32) {
        clear_value(this);
        this->_oneof_case_[0] = 0x32;
      }
      (this->value_).boolvalue_ = bVar1;
      goto LAB_0031f8ca;
    }
    if (iVar2 != 0x3c) goto LAB_0031f8ca;
    pp_Var6 = from[1]._vptr_MessageLite;
    if (this->_oneof_case_[0] != 0x3c) {
      clear_value(this);
      this->_oneof_case_[0] = 0x3c;
      goto LAB_0031f881;
    }
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)&this->value_,(ulong)pp_Var6 & 0xfffffffffffffffe,puVar5);
LAB_0031f8ca:
  uVar4 = (from->_internal_metadata_).ptr_;
  if ((uVar4 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar4 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}